

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::FileLog(FileLog *this,string *path,string *backupPath,SessionID *s)

{
  string local_98;
  string local_78 [32];
  string local_58 [48];
  SessionID *local_28;
  SessionID *s_local;
  string *backupPath_local;
  string *path_local;
  FileLog *this_local;
  
  local_28 = s;
  s_local = (SessionID *)backupPath;
  backupPath_local = path;
  path_local = (string *)this;
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_0030bad8;
  std::ofstream::ofstream(&this->m_messages);
  std::ofstream::ofstream(&this->m_event);
  std::__cxx11::string::string((string *)&this->m_messagesFileName);
  std::__cxx11::string::string((string *)&this->m_eventFileName);
  std::__cxx11::string::string((string *)&this->m_fullPrefix);
  std::__cxx11::string::string((string *)&this->m_fullBackupPrefix);
  std::__cxx11::string::string(local_58,(string *)backupPath_local);
  std::__cxx11::string::string(local_78,(string *)s_local);
  generatePrefix_abi_cxx11_(&local_98,this,local_28);
  init(this,(EVP_PKEY_CTX *)local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

FileLog::FileLog( const std::string& path, const std::string& backupPath, const SessionID& s )
{
  init( path, backupPath, generatePrefix(s) );
}